

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::cancel_schedulers(raft_server *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __fd;
  peer *in_RSI;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  
  peVar1 = (this->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    if ((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      in_RSI = (peer *)&this->election_task_;
      (**(code **)(*(long *)peVar1 + 0x18))();
      LOCK();
      (((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->cancelled_)._M_base._M_i = true;
      UNLOCK();
      in_EDX = extraout_EDX;
    }
    for (p_Var4 = (this->peers_)._M_h._M_before_begin._M_nxt; __fd = (int)in_RSI,
        p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
      if ((p_Var4[2]._M_nxt[0x12]._M_nxt != (_Hash_node_base *)0x0) &&
         (peVar1 = (this->scheduler_).
                   super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr, peVar1 != (element_type *)0x0)) {
        p_Var3 = p_Var4[2]._M_nxt + 0x12;
        p_Var2 = p_Var3;
        (**(code **)(*(long *)peVar1 + 0x18))();
        __fd = (int)p_Var2;
        LOCK();
        *(undefined1 *)&p_Var3->_M_nxt[1]._M_nxt = 1;
        UNLOCK();
        in_EDX = extraout_EDX_00;
      }
      peer::shutdown((peer *)p_Var4[2]._M_nxt,__fd,in_EDX);
      in_RSI = (peer *)p_Var4[2]._M_nxt;
      clear_snapshot_sync_ctx(this,in_RSI);
      in_EDX = extraout_EDX_01;
    }
    this_00 = (this->scheduler_).
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->scheduler_).
    super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->scheduler_).
    super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void raft_server::cancel_schedulers() {
    if (!scheduler_) {
        // Already cancelled.
        return;
    }

    if (election_task_) {
        cancel_task(election_task_);
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        const ptr<peer>& p = it->second;
        if (p->get_hb_task()) {
            cancel_task(p->get_hb_task());
        }
        // Shutdown peer to cut off smart pointers.
        p->shutdown();

        // Free user context of snapshot if exists.
        clear_snapshot_sync_ctx(*p);
    }
    scheduler_.reset();
}